

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t __thiscall
driver::zetDebugWriteMemory
          (driver *this,zet_debug_session_handle_t hDebug,ze_device_thread_t thread,
          zet_debug_memory_space_desc_t *desc,size_t size,void *buffer)

{
  zet_pfnDebugWriteMemory_t pfnWriteMemory;
  ze_result_t result;
  void *buffer_local;
  size_t size_local;
  zet_debug_memory_space_desc_t *desc_local;
  zet_debug_session_handle_t hDebug_local;
  ze_device_thread_t thread_local;
  
  pfnWriteMemory._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c990 != (code *)0x0) {
    pfnWriteMemory._4_4_ = (*DAT_0011c990)(this,hDebug,thread._0_8_,thread._8_8_,desc,size);
  }
  return pfnWriteMemory._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDebugWriteMemory(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        ze_device_thread_t thread,                      ///< [in] the thread identifier.
        const zet_debug_memory_space_desc_t* desc,      ///< [in] memory space descriptor
        size_t size,                                    ///< [in] the number of bytes to write
        const void* buffer                              ///< [in] a buffer holding the pattern to write
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnWriteMemory = context.zetDdiTable.Debug.pfnWriteMemory;
        if( nullptr != pfnWriteMemory )
        {
            result = pfnWriteMemory( hDebug, thread, desc, size, buffer );
        }
        else
        {
            // generic implementation
        }

        return result;
    }